

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_sstream.c
# Opt level: O2

void HTS_SStreamSet_clear(HTS_SStreamSet *sss)

{
  HTS_SStream *ptr;
  ulong uVar1;
  ulong uVar2;
  
  if (sss->sstream != (HTS_SStream *)0x0) {
    for (uVar2 = 0; ptr = sss->sstream, uVar2 < sss->nstream; uVar2 = uVar2 + 1) {
      for (uVar1 = 0; uVar1 < sss->total_state; uVar1 = uVar1 + 1) {
        HTS_free(ptr[uVar2].mean[uVar1]);
        HTS_free(ptr[uVar2].vari[uVar1]);
      }
      if (ptr[uVar2].msd != (double *)0x0) {
        HTS_free(ptr[uVar2].msd);
      }
      HTS_free(ptr[uVar2].mean);
      HTS_free(ptr[uVar2].vari);
      for (uVar1 = 0; uVar1 < ptr[uVar2].win_size; uVar1 = uVar1 + 1) {
        ptr[uVar2].win_coefficient[uVar1] =
             ptr[uVar2].win_coefficient[uVar1] + ptr[uVar2].win_l_width[uVar1];
        HTS_free(ptr[uVar2].win_coefficient[uVar1]);
      }
      HTS_free(ptr[uVar2].win_coefficient);
      HTS_free(ptr[uVar2].win_l_width);
      HTS_free(ptr[uVar2].win_r_width);
      if (ptr[uVar2].gv_mean != (double *)0x0) {
        HTS_free(ptr[uVar2].gv_mean);
      }
      if (ptr[uVar2].gv_vari != (double *)0x0) {
        HTS_free(ptr[uVar2].gv_vari);
      }
      if (ptr[uVar2].gv_switch != (HTS_Boolean *)0x0) {
        HTS_free(ptr[uVar2].gv_switch);
      }
    }
    HTS_free(ptr);
  }
  if (sss->duration != (size_t *)0x0) {
    HTS_free(sss->duration);
  }
  sss->total_state = 0;
  sss->total_frame = 0;
  sss->nstate = 0;
  sss->duration = (size_t *)0x0;
  sss->sstream = (HTS_SStream *)0x0;
  sss->nstream = 0;
  return;
}

Assistant:

void HTS_SStreamSet_clear(HTS_SStreamSet * sss)
{
   size_t i, j;
   HTS_SStream *sst;

   if (sss->sstream) {
      for (i = 0; i < sss->nstream; i++) {
         sst = &sss->sstream[i];
         for (j = 0; j < sss->total_state; j++) {
            HTS_free(sst->mean[j]);
            HTS_free(sst->vari[j]);
         }
         if (sst->msd)
            HTS_free(sst->msd);
         HTS_free(sst->mean);
         HTS_free(sst->vari);
         for (j = 0; j < sst->win_size; j++) {
            sst->win_coefficient[j] += sst->win_l_width[j];
            HTS_free(sst->win_coefficient[j]);
         }
         HTS_free(sst->win_coefficient);
         HTS_free(sst->win_l_width);
         HTS_free(sst->win_r_width);
         if (sst->gv_mean)
            HTS_free(sst->gv_mean);
         if (sst->gv_vari)
            HTS_free(sst->gv_vari);
         if (sst->gv_switch)
            HTS_free(sst->gv_switch);
      }
      HTS_free(sss->sstream);
   }
   if (sss->duration)
      HTS_free(sss->duration);

   HTS_SStreamSet_initialize(sss);
}